

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cordz_info.cc
# Opt level: O0

void __thiscall
absl::lts_20250127::cord_internal::anon_unknown_16::CordRepAnalyzer::AnalyzeCordRep
          (CordRepAnalyzer *this,CordRep *rep)

{
  double dVar1;
  RepRef rep_00;
  RepRef rep_01;
  CordRepKind CVar2;
  CordRepCrc *pCVar3;
  ulong uVar4;
  CordRep *local_98;
  anon_class_1_0_00000001 local_79;
  CordRep *local_78;
  CordRep *local_70;
  CordRep *local_68;
  CordRep *pCStack_60;
  RepRef local_58;
  RepRef local_48;
  undefined1 auStack_38 [8];
  RepRef repref;
  size_t refcount;
  CordRep *local_18;
  CordRep *rep_local;
  CordRepAnalyzer *this_local;
  
  local_18 = rep;
  rep_local = (CordRep *)this;
  if (rep == (CordRep *)0x0) {
    AnalyzeCordRep::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)((long)&refcount + 7));
  }
  repref.refcount = RefcountAndFlags::Get(&local_18->refcount);
  auStack_38 = (undefined1  [8])local_18;
  if (repref.refcount < 2) {
    local_98 = (CordRep *)0x1;
  }
  else {
    local_98 = (CordRep *)(repref.refcount - 1);
  }
  repref.rep = local_98;
  CVar2 = RepRef::tag((RepRef *)auStack_38);
  if (CVar2 == CRC) {
    this->statistics_->node_count = this->statistics_->node_count + 1;
    (this->statistics_->node_counts).crc = (this->statistics_->node_counts).crc + 1;
    MemoryUsage::Add(&this->memory_usage_,0x20,(size_t)repref.rep);
    pCVar3 = CordRep::crc((CordRep *)auStack_38);
    local_48 = RepRef::Child((RepRef *)auStack_38,pCVar3->child);
    auStack_38 = (undefined1  [8])local_48.rep;
    repref.rep = (CordRep *)local_48.refcount;
  }
  local_68 = (CordRep *)auStack_38;
  pCStack_60 = repref.rep;
  rep_01.refcount = (size_t)repref.rep;
  rep_01.rep = (CordRep *)auStack_38;
  local_58 = CountLinearReps(this,rep_01,&this->memory_usage_);
  auStack_38 = (undefined1  [8])local_58.rep;
  repref.rep = (CordRep *)local_58.refcount;
  CVar2 = RepRef::tag((RepRef *)auStack_38);
  if (CVar2 == BTREE) {
    local_78 = (CordRep *)auStack_38;
    local_70 = repref.rep;
    rep_00.refcount = (size_t)repref.rep;
    rep_00.rep = (CordRep *)auStack_38;
    AnalyzeBtree(this,rep_00);
  }
  else {
    CVar2 = RepRef::tag((RepRef *)auStack_38);
    if (CVar2 != UNUSED_0) {
      AnalyzeCordRep::anon_class_1_0_00000001::operator()(&local_79);
    }
  }
  this->statistics_->estimated_memory_usage =
       this->statistics_->estimated_memory_usage + (this->memory_usage_).total;
  dVar1 = (this->memory_usage_).fair_share;
  uVar4 = (ulong)dVar1;
  this->statistics_->estimated_fair_share_memory_usage =
       (uVar4 | (long)(dVar1 - 9.223372036854776e+18) & (long)uVar4 >> 0x3f) +
       this->statistics_->estimated_fair_share_memory_usage;
  return;
}

Assistant:

void AnalyzeCordRep(const CordRep* rep) {
    ABSL_ASSERT(rep != nullptr);

    // Process all linear nodes.
    // As per the class comments, use refcout - 1 on the top level node, as the
    // top level node is assumed to be referenced only for analysis purposes.
    size_t refcount = rep->refcount.Get();
    RepRef repref{rep, (refcount > 1) ? refcount - 1 : 1};

    // Process the top level CRC node, if present.
    if (repref.tag() == CRC) {
      statistics_.node_count++;
      statistics_.node_counts.crc++;
      memory_usage_.Add(sizeof(CordRepCrc), repref.refcount);
      repref = repref.Child(repref.rep->crc()->child);
    }

    // Process all top level linear nodes (substrings and flats).
    repref = CountLinearReps(repref, memory_usage_);

    switch (repref.tag()) {
      case CordRepKind::BTREE:
        AnalyzeBtree(repref);
        break;
      default:
        // We should have a btree node if not null.
        ABSL_ASSERT(repref.tag() == CordRepKind::UNUSED_0);
        break;
    }

    // Adds values to output
    statistics_.estimated_memory_usage += memory_usage_.total;
    statistics_.estimated_fair_share_memory_usage +=
        static_cast<size_t>(memory_usage_.fair_share);
  }